

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

void __thiscall kj::VectorOutputStream::grow(VectorOutputStream *this,size_t minSize)

{
  uchar *__src;
  uchar *__dest;
  ulong count;
  Array<unsigned_char> newVector;
  Array<unsigned_char> local_40;
  
  count = (this->vector).size_;
  do {
    count = count * 2;
  } while (count < minSize);
  __dest = _::HeapArrayDisposer::allocate<unsigned_char>(count);
  local_40.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  __src = (this->vector).ptr;
  local_40.ptr = __dest;
  local_40.size_ = count;
  memcpy(__dest,__src,(long)this->fillPos - (long)__src);
  this->fillPos = __dest + ((long)this->fillPos - (long)(this->vector).ptr);
  Array<unsigned_char>::operator=(&this->vector,&local_40);
  Array<unsigned_char>::~Array(&local_40);
  return;
}

Assistant:

void VectorOutputStream::grow(size_t minSize) {
  size_t newSize = vector.size() * 2;
  while (newSize < minSize) newSize *= 2;
  auto newVector = heapArray<byte>(newSize);
  memcpy(newVector.begin(), vector.begin(), fillPos - vector.begin());
  fillPos = fillPos - vector.begin() + newVector.begin();
  vector = kj::mv(newVector);
}